

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::Postprocess_CollectMetadata
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiNode *pSceneNode)

{
  _List_node_base *p_Var1;
  aiMetadata *paVar2;
  DeadlyImportError *pDVar3;
  uint index;
  size_t __n;
  _List_node_base *pList;
  allocator local_471;
  void *local_470;
  ulong local_468;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> meta_list;
  aiString tstr;
  
  pList = (_List_node_base *)&meta_list;
  meta_list.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  meta_list.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = pList;
  meta_list.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = pList;
  PostprocessHelper_CollectMetadata
            (this,pNodeElement,
             (list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)pList)
  ;
  if (meta_list.
      super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
      _M_impl._M_node.super__List_node_base._M_next != pList) {
    if (pSceneNode->mMetaData != (aiMetadata *)0x0) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&tstr,
                 "Postprocess. MetaData member in node are not nullptr. Something went wrong.",
                 (allocator *)&local_470);
      DeadlyImportError::DeadlyImportError(pDVar3,(string *)&tstr);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar2 = aiMetadata::Alloc((uint)meta_list.
                                     super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                     ._M_impl._M_node._M_size);
    pSceneNode->mMetaData = paVar2;
    index = 0;
    while( true ) {
      pList = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                 *)&pList->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (pList == (_List_node_base *)&meta_list) break;
      p_Var1 = pList[1]._M_next;
      switch(*(undefined4 *)&p_Var1->_M_prev) {
      case 1:
        if (((long)p_Var1[10]._M_next - (long)p_Var1[9]._M_next) * 8 +
            (ulong)*(uint *)&p_Var1[10]._M_prev != 0) {
          tstr.data[4] = '\x01';
          tstr.data[5] = '\0';
          tstr.data[6] = '\0';
          tstr.data[7] = '\0';
          tstr.data[8] = '\0';
          tstr.data[9] = '\0';
          tstr.data[10] = '\0';
          tstr.data[0xb] = '\0';
          tstr._0_8_ = p_Var1[9]._M_next;
          aiMetadata::Set<std::_Bit_reference>
                    (pSceneNode->mMetaData,index,(string *)(p_Var1 + 5),(_Bit_reference *)&tstr);
        }
        break;
      case 2:
        if (p_Var1[9]._M_prev != p_Var1[9]._M_next) {
          tstr.length = (ai_uint32)(float)(double)(p_Var1[9]._M_next)->_M_next;
          aiMetadata::Set<float>(pSceneNode->mMetaData,index,(string *)(p_Var1 + 5),(float *)&tstr);
        }
        break;
      case 3:
        if (p_Var1[9]._M_prev != p_Var1[9]._M_next) {
          aiMetadata::Set<float>
                    (pSceneNode->mMetaData,index,(string *)(p_Var1 + 5),(float *)p_Var1[9]._M_next);
        }
        break;
      case 4:
        if (p_Var1[9]._M_prev != p_Var1[9]._M_next) {
          aiMetadata::Set<int>
                    (pSceneNode->mMetaData,index,(string *)(p_Var1 + 5),(int *)p_Var1[9]._M_next);
        }
        break;
      default:
        pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&tstr,"Postprocess. Unknown metadata type.",(allocator *)&local_470);
        DeadlyImportError::DeadlyImportError(pDVar3,(string *)&tstr);
        __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      case 6:
        if (p_Var1[10]._M_next != (_List_node_base *)0x0) {
          std::__cxx11::string::string
                    ((string *)&local_470,(char *)p_Var1[9]._M_next[1]._M_next,&local_471);
          __n = local_468 & 0xffffffff;
          if ((local_468 & 0xfffffc00) != 0) {
            __n = 0x3ff;
          }
          tstr.length = (ai_uint32)__n;
          memcpy(tstr.data,local_470,__n);
          tstr.data[__n] = '\0';
          std::__cxx11::string::~string((string *)&local_470);
          aiMetadata::Set<aiString>(pSceneNode->mMetaData,index,(string *)(p_Var1 + 5),&tstr);
        }
      }
      index = index + 1;
    }
  }
  std::__cxx11::_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
  ::_M_clear(&meta_list.
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            );
  return;
}

Assistant:

void X3DImporter::Postprocess_CollectMetadata(const CX3DImporter_NodeElement& pNodeElement, aiNode& pSceneNode) const
{
    std::list<CX3DImporter_NodeElement*> meta_list;
    size_t meta_idx;

	PostprocessHelper_CollectMetadata(pNodeElement, meta_list);// find metadata in current node element.
	if ( !meta_list.empty() )
	{
        if ( pSceneNode.mMetaData != nullptr ) {
            throw DeadlyImportError( "Postprocess. MetaData member in node are not nullptr. Something went wrong." );
        }

		// copy collected metadata to output node.
        pSceneNode.mMetaData = aiMetadata::Alloc( static_cast<unsigned int>(meta_list.size()) );
		meta_idx = 0;
		for(std::list<CX3DImporter_NodeElement*>::const_iterator it = meta_list.begin(); it != meta_list.end(); ++it, ++meta_idx)
		{
			CX3DImporter_NodeElement_Meta* cur_meta = (CX3DImporter_NodeElement_Meta*)*it;

			// due to limitations we can add only first element of value list.
			// Add an element according to its type.
			if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaBoolean)
			{
				if(((CX3DImporter_NodeElement_MetaBoolean*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, *(((CX3DImporter_NodeElement_MetaBoolean*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaDouble)
			{
				if(((CX3DImporter_NodeElement_MetaDouble*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, (float)*(((CX3DImporter_NodeElement_MetaDouble*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaFloat)
			{
				if(((CX3DImporter_NodeElement_MetaFloat*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, *(((CX3DImporter_NodeElement_MetaFloat*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaInteger)
			{
				if(((CX3DImporter_NodeElement_MetaInteger*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, *(((CX3DImporter_NodeElement_MetaInteger*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaString)
			{
				if(((CX3DImporter_NodeElement_MetaString*)cur_meta)->Value.size() > 0)
				{
					aiString tstr(((CX3DImporter_NodeElement_MetaString*)cur_meta)->Value.begin()->data());

					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, tstr);
				}
			}
			else
			{
				throw DeadlyImportError("Postprocess. Unknown metadata type.");
			}// if((*it)->Type == CX3DImporter_NodeElement::ENET_Meta*) else
		}// for(std::list<CX3DImporter_NodeElement*>::const_iterator it = meta_list.begin(); it != meta_list.end(); it++)
	}// if( !meta_list.empty() )
}